

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

PropertyID lunasvg::propertyid(string_view *name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  PropertyID PVar2;
  anon_struct_24_2_b8fd76e8 *paVar3;
  anon_struct_24_2_b8fd76e8 *paVar4;
  anon_struct_24_2_b8fd76e8 *it;
  string_view *name_local;
  
  paVar3 = std::
           end<lunasvg::propertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__0_const,47ul>
                     (&propertyid::table);
  paVar3 = std::
           lower_bound<lunasvg::propertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__0_const*,std::basic_string_view<char,std::char_traits<char>>,lunasvg::propertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__1>
                     (propertyid::table,paVar3,name);
  paVar4 = std::
           end<lunasvg::propertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__0_const,47ul>
                     (&propertyid::table);
  if ((paVar3 != paVar4) &&
     (__x._M_len = (paVar3->name)._M_len, __x._M_str = (paVar3->name)._M_str,
     __y._M_len = name->_M_len, __y._M_str = name->_M_str, bVar1 = std::operator!=(__x,__y), !bVar1)
     ) {
    return paVar3->value;
  }
  PVar2 = csspropertyid(name);
  return PVar2;
}

Assistant:

PropertyID propertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"class", PropertyID::Class},
        {"clipPathUnits", PropertyID::ClipPathUnits},
        {"cx", PropertyID::Cx},
        {"cy", PropertyID::Cy},
        {"d", PropertyID::D},
        {"dx", PropertyID::Dx},
        {"dy", PropertyID::Dy},
        {"fx", PropertyID::Fx},
        {"fy", PropertyID::Fy},
        {"gradientTransform", PropertyID::GradientTransform},
        {"gradientUnits", PropertyID::GradientUnits},
        {"height", PropertyID::Height},
        {"href", PropertyID::Href},
        {"id", PropertyID::Id},
        {"lengthAdjust", PropertyID::LengthAdjust},
        {"markerHeight", PropertyID::MarkerHeight},
        {"markerUnits", PropertyID::MarkerUnits},
        {"markerWidth", PropertyID::MarkerWidth},
        {"maskContentUnits", PropertyID::MaskContentUnits},
        {"maskUnits", PropertyID::MaskUnits},
        {"offset", PropertyID::Offset},
        {"orient", PropertyID::Orient},
        {"patternContentUnits", PropertyID::PatternContentUnits},
        {"patternTransform", PropertyID::PatternTransform},
        {"patternUnits", PropertyID::PatternUnits},
        {"points", PropertyID::Points},
        {"preserveAspectRatio", PropertyID::PreserveAspectRatio},
        {"r", PropertyID::R},
        {"refX", PropertyID::RefX},
        {"refY", PropertyID::RefY},
        {"rotate", PropertyID::Rotate},
        {"rx", PropertyID::Rx},
        {"ry", PropertyID::Ry},
        {"spreadMethod", PropertyID::SpreadMethod},
        {"style", PropertyID::Style},
        {"textLength", PropertyID::TextLength},
        {"transform", PropertyID::Transform},
        {"viewBox", PropertyID::ViewBox},
        {"width", PropertyID::Width},
        {"x", PropertyID::X},
        {"x1", PropertyID::X1},
        {"x2", PropertyID::X2},
        {"xlink:href", PropertyID::Href},
        {"xml:space", PropertyID::WhiteSpace},
        {"y", PropertyID::Y},
        {"y1", PropertyID::Y1},
        {"y2", PropertyID::Y2}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return csspropertyid(name);
    return it->value;
}